

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search_sequencetask.cc
# Opt level: O2

void SequenceTask_DemoLDF::initialize(search *sch,size_t *num_actions,options_i *param_3)

{
  example *peVar1;
  task_data *ptVar2;
  ulong uVar3;
  v_array<COST_SENSITIVE::wclass> *this;
  wclass default_wclass;
  
  default_wclass.x = 0.0;
  default_wclass.class_index = 0;
  default_wclass.partial_prediction = 0.0;
  default_wclass.wap_value = 0.0;
  peVar1 = VW::alloc_examples(0x20,*num_actions);
  this = (v_array<COST_SENSITIVE::wclass> *)&peVar1->l;
  for (uVar3 = 0; uVar3 < *num_actions; uVar3 = uVar3 + 1) {
    (*(code *)COST_SENSITIVE::cs_label)(this);
    v_array<COST_SENSITIVE::wclass>::push_back(this,&default_wclass);
    this = (v_array<COST_SENSITIVE::wclass> *)&this[0x346].end_array;
  }
  ptVar2 = calloc_or_throw<SequenceTask_DemoLDF::task_data>();
  ptVar2->ldf_examples = peVar1;
  ptVar2->num_actions = *num_actions;
  sch->task_data = ptVar2;
  Search::search::set_options
            (sch,Search::AUTO_HAMMING_LOSS | Search::AUTO_CONDITION_FEATURES | Search::IS_LDF);
  return;
}

Assistant:

void initialize(Search::search& sch, size_t& num_actions, options_i& /*options*/)
{
  CS::wclass default_wclass = {0., 0, 0., 0.};

  example* ldf_examples = VW::alloc_examples(sizeof(CS::label), num_actions);
  for (size_t a = 0; a < num_actions; a++)
  {
    CS::label& lab = ldf_examples[a].l.cs;
    CS::cs_label.default_label(&lab);
    lab.costs.push_back(default_wclass);
  }

  task_data* data = &calloc_or_throw<task_data>();
  data->ldf_examples = ldf_examples;
  data->num_actions = num_actions;

  sch.set_task_data<task_data>(data);
  sch.set_options(Search::AUTO_CONDITION_FEATURES |  // automatically add history features to our examples, please
      Search::AUTO_HAMMING_LOSS |  // please just use hamming loss on individual predictions -- we won't declare loss
      Search::IS_LDF);             // we generate ldf examples
}